

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int coda_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  coda_backend cVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  char *message;
  int has_ascii_content;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (dst == (char *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0xabb);
    return -1;
  }
  if (dst_size < 1) {
    coda_set_error(-100,"dst_size (%ld) argument is <= 0 (%s:%u)",dst_size,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0xac1);
    return -1;
  }
  iVar2 = coda_cursor_has_ascii_content(cursor,&local_24);
  iVar3 = -1;
  if (iVar2 != 0) {
    return -1;
  }
  if (local_24 == 0) {
    message = "cursor does not refer to text";
    iVar2 = -0x69;
    goto LAB_00127872;
  }
  cVar1 = (cursor->stack[(long)cursor->n + -1].type)->backend;
  switch(cVar1) {
  case coda_backend_memory:
    iVar3 = coda_mem_cursor_read_string(cursor,dst,dst_size);
    break;
  case coda_backend_hdf4:
    iVar2 = -0xb;
    goto LAB_00127870;
  case coda_backend_hdf5:
    iVar2 = -0xd;
LAB_00127870:
    message = (char *)0x0;
LAB_00127872:
    coda_set_error(iVar2,message);
    break;
  case coda_backend_cdf:
    iVar3 = coda_cdf_cursor_read_string(cursor,dst,dst_size);
    break;
  case coda_backend_netcdf:
    iVar3 = coda_netcdf_cursor_read_string(cursor,dst,dst_size);
    break;
  default:
    if (cVar1 == coda_backend_binary) {
      iVar3 = coda_bin_cursor_read_string(cursor,dst,dst_size);
    }
    else {
      if (cVar1 != coda_backend_ascii) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                      ,0x2f6,"int read_string(const coda_cursor *, char *, long)");
      }
      iVar3 = coda_ascii_cursor_read_string(cursor,dst,dst_size);
    }
  }
  return iVar3;
}

Assistant:

LIBCODA_API int coda_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    int has_ascii_content;

    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_size <= 0)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_size (%ld) argument is <= 0 (%s:%u)", dst_size, __FILE__,
                       __LINE__);
        return -1;
    }

    if (coda_cursor_has_ascii_content(cursor, &has_ascii_content) != 0)
    {
        return -1;
    }
    if (!has_ascii_content)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to text");
        return -1;
    }

    return read_string(cursor, dst, dst_size);
}